

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureGatherTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::TextureGatherCase::iterate(TextureGatherCase *this)

{
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *pMVar1;
  ostringstream *poVar2;
  GatherType GVar3;
  TextureType TVar4;
  GatherType GVar5;
  ChannelType CVar6;
  ShaderProgram *pSVar7;
  int iVar8;
  DataType DVar9;
  uint uVar10;
  TextureFormat *pTVar11;
  long *plVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 *puVar13;
  _Alloc_hider _Var14;
  TestError *pTVar15;
  int i;
  ChannelType CVar16;
  TextureFormat TVar17;
  size_type *psVar18;
  long *plVar19;
  ulong *puVar20;
  TextureFormat TVar21;
  undefined1 *puVar22;
  int j;
  long lVar23;
  IterateResult IVar24;
  int j_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  ulong uVar26;
  char *pcVar27;
  long lVar28;
  int iVar29;
  bool bVar30;
  string texCoordType;
  vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> attrBindings;
  string texCoordType_1;
  float normalizedCoord [8];
  ScopedLogSection iterationSection;
  Vec2 texCoordVec [4];
  string refZExpr;
  string vertexSource;
  char *__end;
  string funcCall;
  float position [8];
  uint in_stack_fffffffffffff92c;
  int in_stack_fffffffffffff930;
  size_type *local_6c0;
  value_type local_6b8;
  string local_698;
  string local_670;
  ulong local_650;
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *local_648;
  allocator<char> local_639;
  long *local_638;
  long local_630;
  long local_628;
  long lStack_620;
  ulong *local_618;
  long local_610;
  ulong local_608;
  long lStack_600;
  undefined1 local_5f8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e8 [2];
  long *local_5c8;
  long local_5c0;
  long local_5b8;
  long lStack_5b0;
  long *local_5a8;
  long local_5a0;
  long local_598;
  long lStack_590;
  long *local_588;
  long local_580;
  long local_578;
  long lStack_570;
  long *local_568;
  long local_560;
  long local_558;
  long lStack_550;
  long *local_548;
  long local_540;
  long local_538;
  long lStack_530;
  long *local_528;
  long local_520;
  long local_518;
  long lStack_510;
  TextureFormat *local_508;
  RenderContext *local_500;
  long *local_4f8;
  long local_4f0;
  long local_4e8;
  long lStack_4e0;
  long local_4d8;
  long *local_4d0;
  long local_4c8;
  long local_4c0;
  long lStack_4b8;
  TextureFormat local_4b0;
  ShaderProgram *local_4a8;
  ScopedLogSection local_4a0;
  long *local_498;
  long local_490;
  long local_488;
  long lStack_480;
  undefined1 local_478 [8];
  TextureFormat TStack_470;
  undefined1 local_468 [16];
  undefined1 local_458 [8];
  undefined8 uStack_450;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_3e8;
  FilterMode local_3d0;
  undefined1 local_3c8 [24];
  undefined1 uStack_3b0;
  undefined1 local_3a8 [32];
  ulong *local_388;
  long local_380;
  ulong local_378 [2];
  long *local_368;
  long local_360;
  long local_358;
  long lStack_350;
  undefined1 local_348 [8];
  TextureFormat local_340;
  size_type **local_338;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_330;
  int local_320;
  VertexArrayPointer local_318 [2];
  ios_base local_2d8 [8];
  ios_base local_2d0 [264];
  char *local_1c8;
  long *local_1c0;
  long local_1b8;
  long local_1b0;
  long lStack_1a8;
  long *local_1a0;
  long local_198;
  long local_190;
  long lStack_188;
  undefined1 local_180 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  string local_158 [16];
  qpWatchDog *local_148 [2];
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_138;
  undefined1 local_128 [144];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_98;
  FilterMode local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  bool local_60;
  TextureFormat local_54 [4];
  
  TVar21 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  std::ostream::operator<<((ostringstream *)local_348,this->m_currentIteration);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base(local_2d8);
  pTVar11 = (TextureFormat *)std::__cxx11::string::replace((ulong)local_128,0,(char *)0x0,0x1c10744)
  ;
  TVar17 = (TextureFormat)(pTVar11 + 2);
  if (*pTVar11 == TVar17) {
    local_468._0_8_ = *(undefined8 *)TVar17;
    local_468._8_8_ = pTVar11[3];
    local_478 = (undefined1  [8])local_468;
  }
  else {
    local_468._0_8_ = *(undefined8 *)TVar17;
    local_478 = (undefined1  [8])*pTVar11;
  }
  TStack_470 = pTVar11[1];
  *pTVar11 = TVar17;
  pTVar11[1].order = R;
  pTVar11[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar11[2].order = R;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  std::ostream::operator<<(local_348,this->m_currentIteration);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base(local_2d8);
  plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_6c0,0,(char *)0x0,0x1ca13c7);
  paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 == paVar25) {
    local_5e8[0]._0_8_ = paVar25->_M_allocated_capacity;
    local_5e8[0]._8_8_ = plVar12[3];
    local_5f8._0_8_ = local_5e8;
  }
  else {
    local_5e8[0]._0_8_ = paVar25->_M_allocated_capacity;
    local_5f8._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar12;
  }
  local_5f8._8_8_ = plVar12[1];
  *plVar12 = (long)paVar25;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  tcu::ScopedLogSection::ScopedLogSection
            (&local_4a0,(TestLog *)TVar21,(string *)local_478,(string *)local_5f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f8._0_8_ != local_5e8) {
    operator_delete((void *)local_5f8._0_8_,local_5e8[0]._M_allocated_capacity + 1);
  }
  if (local_6c0 != (size_type *)((long)&local_6b8 + 8U)) {
    operator_delete(local_6c0,local_6b8._M_string_length + 1);
  }
  if (local_478 != (undefined1  [8])local_468) {
    operator_delete((void *)local_478,local_468._0_8_ + 1);
  }
  if (local_128._0_8_ != (long)local_128 + 0x10) {
    operator_delete((void *)local_128._0_8_,(ulong)(local_128._16_8_ + 1));
  }
  local_500 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar8 = (*local_500->_vptr_RenderContext[3])();
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[8])
            (local_54,this,(ulong)(uint)this->m_currentIteration);
  local_3a8._0_8_ = local_3a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3a8,"v_normalizedCoord.x","");
  GVar3 = this->m_gatherType;
  bVar30 = true;
  if (GVar3 != GATHERTYPE_OFFSET_DYNAMIC) {
    bVar30 = ((this->m_textureFormat).order - D & 0xfffffffd) == 0;
  }
  local_4a8 = (ShaderProgram *)operator_new(0xd0);
  TVar4 = this->m_textureType;
  uVar26 = (ulong)TVar4;
  getOffsetRange((TextureGatherCase *)local_180);
  local_508 = &this->m_textureFormat;
  if ((local_508->order == DS) || (local_508->order == D)) {
    local_650 = 0x5e;
    if (TVar4 < TEXTURETYPE_3D) {
      local_650 = (ulong)*(uint *)(&DAT_01ccb2dc + uVar26 * 4);
    }
  }
  else if (uVar26 == 2) {
    DVar9 = glu::getSampler2DArrayType(*local_508);
    local_650 = CONCAT44(extraout_var_02,DVar9);
  }
  else if (TVar4 == TEXTURETYPE_CUBE) {
    DVar9 = glu::getSamplerCubeType(*local_508);
    local_650 = CONCAT44(extraout_var_01,DVar9);
  }
  else {
    local_650 = 0x5e;
    if (TVar4 == TEXTURETYPE_2D) {
      DVar9 = glu::getSampler2DType(*local_508);
      local_650 = CONCAT44(extraout_var_00,DVar9);
    }
  }
  local_648._0_4_ = 0xffffffff;
  if (TVar4 < TEXTURETYPE_3D) {
    local_648._0_4_ = *(int *)(&DAT_01ccb2e8 + uVar26 * 4);
  }
  genGatherFuncCall((string *)(local_180 + 8),(TextureGatherCase *)(ulong)GVar3,
                    (GatherType)local_508,local_54,(GatherArgs *)local_3a8,(string *)local_180,
                    (IVec2 *)CONCAT44(in_stack_fffffffffffff92c,1),in_stack_fffffffffffff930);
  puVar22 = local_478;
  local_3c8[0x10] = 0;
  stack0xfffffffffffffc49 = 0;
  local_3c8._0_8_ = (pointer)0x0;
  local_3c8[8] = 0;
  local_3c8._9_7_ = 0;
  local_4b0 = TVar21;
  memset(puVar22,0,0xac);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  std::ostream::operator<<(local_348,(int)local_648);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base(local_2d8);
  plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_670,0,(char *)0x0,0x1c09a8d);
  psVar18 = (size_type *)(plVar12 + 2);
  if ((size_type *)*plVar12 == psVar18) {
    local_6b8._M_string_length = *psVar18;
    local_6b8.field_2._M_allocated_capacity = plVar12[3];
    local_6c0 = (size_type *)((long)&local_6b8 + 8U);
  }
  else {
    local_6b8._M_string_length = *psVar18;
    local_6c0 = (size_type *)*plVar12;
  }
  local_6b8._M_dataplus._M_p = (pointer)plVar12[1];
  *plVar12 = (long)psVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  local_4d8 = CONCAT44(extraout_var,iVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  pcVar27 = "${GPU_SHADER5_REQUIRE}\n";
  if ((GVar3 & ~GATHERTYPE_OFFSET) != GATHERTYPE_OFFSET_DYNAMIC) {
    pcVar27 = "";
  }
  local_4f8 = &local_4e8;
  local_1c8 = pcVar27 + 0x17;
  if ((GVar3 & ~GATHERTYPE_OFFSET) != GATHERTYPE_OFFSET_DYNAMIC) {
    local_1c8 = pcVar27;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8);
  plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_4f8,0,(char *)0x0,0x1c7f9ff);
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_4c0 = *plVar19;
    lStack_4b8 = plVar12[3];
    local_4d0 = &local_4c0;
  }
  else {
    local_4c0 = *plVar19;
    local_4d0 = (long *)*plVar12;
  }
  local_4c8 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_4d0);
  local_5c8 = &local_5b8;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_5b8 = *plVar19;
    lStack_5b0 = plVar12[3];
  }
  else {
    local_5b8 = *plVar19;
    local_5c8 = (long *)*plVar12;
  }
  local_5c0 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_5c8,(ulong)local_6c0);
  local_618 = &local_608;
  puVar20 = (ulong *)(plVar12 + 2);
  if ((ulong *)*plVar12 == puVar20) {
    local_608 = *puVar20;
    lStack_600 = plVar12[3];
  }
  else {
    local_608 = *puVar20;
    local_618 = (ulong *)*plVar12;
  }
  local_610 = plVar12[1];
  *plVar12 = (long)puVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_618);
  local_638 = &local_628;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_628 = *plVar19;
    lStack_620 = plVar12[3];
  }
  else {
    local_628 = *plVar19;
    local_638 = (long *)*plVar12;
  }
  paVar25 = &local_670.field_2;
  local_630 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_638);
  local_5a8 = &local_598;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_598 = *plVar19;
    lStack_590 = plVar12[3];
  }
  else {
    local_598 = *plVar19;
    local_5a8 = (long *)*plVar12;
  }
  local_5a0 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_5a8);
  local_588 = &local_578;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_578 = *plVar19;
    lStack_570 = plVar12[3];
  }
  else {
    local_578 = *plVar19;
    local_588 = (long *)*plVar12;
  }
  local_580 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_588,(ulong)local_6c0);
  local_568 = &local_558;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_558 = *plVar19;
    lStack_550 = plVar12[3];
  }
  else {
    local_558 = *plVar19;
    local_568 = (long *)*plVar12;
  }
  local_560 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_568);
  local_548 = &local_538;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_538 = *plVar19;
    lStack_530 = plVar12[3];
  }
  else {
    local_538 = *plVar19;
    local_548 = (long *)*plVar12;
  }
  local_540 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_548);
  local_528 = &local_518;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_518 = *plVar19;
    lStack_510 = plVar12[3];
  }
  else {
    local_518 = *plVar19;
    local_528 = (long *)*plVar12;
  }
  local_520 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_528);
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  psVar18 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_698.field_2._M_allocated_capacity = *psVar18;
    local_698.field_2._8_8_ = plVar12[3];
  }
  else {
    local_698.field_2._M_allocated_capacity = *psVar18;
    local_698._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_698._M_string_length = plVar12[1];
  *plVar12 = (long)psVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_698);
  psVar18 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_670.field_2._M_allocated_capacity = *psVar18;
    local_670.field_2._8_8_ = plVar12[3];
    local_670._M_dataplus._M_p = (pointer)paVar25;
  }
  else {
    local_670.field_2._M_allocated_capacity = *psVar18;
    local_670._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_670._M_string_length = plVar12[1];
  *plVar12 = (long)psVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  pTVar11 = (TextureFormat *)std::__cxx11::string::append((char *)&local_670);
  local_348 = (undefined1  [8])((long)local_348 + 0x10);
  TVar21 = (TextureFormat)(pTVar11 + 2);
  if (*pTVar11 == TVar21) {
    local_338 = *(size_type ***)TVar21;
    aStack_330._M_allocated_capacity = (size_type)pTVar11[3];
  }
  else {
    local_338 = *(size_type ***)TVar21;
    local_348 = (undefined1  [8])*pTVar11;
  }
  local_340 = pTVar11[1];
  *pTVar11 = TVar21;
  pTVar11[1].order = R;
  pTVar11[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar11[2].order = R;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != paVar25) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if (local_528 != &local_518) {
    operator_delete(local_528,local_518 + 1);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,local_538 + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,local_558 + 1);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588,local_578 + 1);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8,local_598 + 1);
  }
  if (local_638 != &local_628) {
    operator_delete(local_638,local_628 + 1);
  }
  if (local_618 != &local_608) {
    operator_delete(local_618,local_608 + 1);
  }
  if (local_5c8 != &local_5b8) {
    operator_delete(local_5c8,local_5b8 + 1);
  }
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0,local_4c0 + 1);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8,local_4e8 + 1);
  }
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_670,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)local_348,(char *)TVar21);
  local_5f8._0_8_ = local_5f8._0_8_ & 0xffffffff00000000;
  local_5f8._8_8_ = local_5e8[0]._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_5f8 + 8),local_670._M_dataplus._M_p,
             local_670._M_dataplus._M_p + local_670._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != paVar25) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  if (local_348 != (undefined1  [8])((long)local_348 + 0x10)) {
    operator_delete((void *)local_348,(long)local_338 + 1);
  }
  if (local_6c0 != (size_type *)((long)&local_6b8 + 8U)) {
    operator_delete(local_6c0,local_6b8._M_string_length + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_478 + (local_5f8._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_5f8 + 8));
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_348);
  std::ostream::operator<<(local_348,(int)local_648);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_348);
  std::ios_base::~ios_base(local_2d8);
  plVar12 = (long *)std::__cxx11::string::replace((ulong)&local_698,0,(char *)0x0,0x1c09a8d);
  psVar18 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_670.field_2._M_allocated_capacity = *psVar18;
    local_670.field_2._8_8_ = plVar12[3];
    local_670._M_dataplus._M_p = (pointer)paVar25;
  }
  else {
    local_670.field_2._M_allocated_capacity = *psVar18;
    local_670._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_670._M_string_length = plVar12[1];
  *plVar12 = (long)psVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  local_158._0_8_ = local_148;
  std::__cxx11::string::_M_construct<char_const*>(local_158,pcVar27,local_1c8);
  plVar12 = (long *)std::__cxx11::string::replace((ulong)local_158,0,(char *)0x0,0x1c7f9ff);
  local_368 = &local_358;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_358 = *plVar19;
    lStack_350 = plVar12[3];
  }
  else {
    local_358 = *plVar19;
    local_368 = (long *)*plVar12;
  }
  local_360 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_368);
  local_498 = &local_488;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_488 = *plVar19;
    lStack_480 = plVar12[3];
  }
  else {
    local_488 = *plVar19;
    local_498 = (long *)*plVar12;
  }
  local_490 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  uVar10 = (int)local_650 - 0x28;
  DVar9 = TYPE_LAST;
  if (uVar10 < 0x18) {
    DVar9 = *(DataType *)(&DAT_01ccb2f4 + (ulong)uVar10 * 4);
  }
  glu::getDataTypeName(DVar9);
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_498);
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_1b0 = *plVar19;
    lStack_1a8 = plVar12[3];
    local_1c0 = &local_1b0;
  }
  else {
    local_1b0 = *plVar19;
    local_1c0 = (long *)*plVar12;
  }
  local_1b8 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_1c0);
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_190 = *plVar19;
    lStack_188 = plVar12[3];
    local_1a0 = &local_190;
  }
  else {
    local_190 = *plVar19;
    local_1a0 = (long *)*plVar12;
  }
  local_198 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::_M_append
                              ((char *)&local_1a0,(ulong)local_670._M_dataplus._M_p);
  local_4f8 = &local_4e8;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_4e8 = *plVar19;
    lStack_4e0 = plVar12[3];
  }
  else {
    local_4e8 = *plVar19;
    local_4f8 = (long *)*plVar12;
  }
  local_4f0 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_4f8);
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_4c0 = *plVar19;
    lStack_4b8 = plVar12[3];
    local_4d0 = &local_4c0;
  }
  else {
    local_4c0 = *plVar19;
    local_4d0 = (long *)*plVar12;
  }
  local_4c8 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_4d0);
  local_5c8 = &local_5b8;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_5b8 = *plVar19;
    lStack_5b0 = plVar12[3];
  }
  else {
    local_5b8 = *plVar19;
    local_5c8 = (long *)*plVar12;
  }
  local_5c0 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_5c8);
  local_618 = &local_608;
  puVar20 = (ulong *)(plVar12 + 2);
  if ((ulong *)*plVar12 == puVar20) {
    local_608 = *puVar20;
    lStack_600 = plVar12[3];
  }
  else {
    local_608 = *puVar20;
    local_618 = (ulong *)*plVar12;
  }
  local_610 = plVar12[1];
  *plVar12 = (long)puVar20;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  pcVar27 = glu::getDataTypeName((DataType)local_650);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,pcVar27,&local_639);
  uVar26 = 0xf;
  if (local_618 != &local_608) {
    uVar26 = local_608;
  }
  if (uVar26 < (ulong)(local_380 + local_610)) {
    uVar26 = 0xf;
    if (local_388 != local_378) {
      uVar26 = local_378[0];
    }
    if (uVar26 < (ulong)(local_380 + local_610)) goto LAB_01657172;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_388,0,(char *)0x0,(ulong)local_618);
  }
  else {
LAB_01657172:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_618,(ulong)local_388);
  }
  local_638 = &local_628;
  plVar12 = puVar13 + 2;
  if ((long *)*puVar13 == plVar12) {
    local_628 = *plVar12;
    lStack_620 = puVar13[3];
  }
  else {
    local_628 = *plVar12;
    local_638 = (long *)*puVar13;
  }
  local_630 = puVar13[1];
  *puVar13 = plVar12;
  puVar13[1] = 0;
  *(undefined1 *)plVar12 = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_638);
  local_5a8 = &local_598;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_598 = *plVar19;
    lStack_590 = plVar12[3];
  }
  else {
    local_598 = *plVar19;
    local_5a8 = (long *)*plVar12;
  }
  local_5a0 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_5a8);
  local_588 = &local_578;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_578 = *plVar19;
    lStack_570 = plVar12[3];
  }
  else {
    local_578 = *plVar19;
    local_588 = (long *)*plVar12;
  }
  local_580 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_588);
  local_568 = &local_558;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_558 = *plVar19;
    lStack_550 = plVar12[3];
  }
  else {
    local_558 = *plVar19;
    local_568 = (long *)*plVar12;
  }
  local_560 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_568);
  local_548 = &local_538;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_538 = *plVar19;
    lStack_530 = plVar12[3];
  }
  else {
    local_538 = *plVar19;
    local_548 = (long *)*plVar12;
  }
  local_540 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::append((char *)&local_548);
  local_528 = &local_518;
  plVar19 = plVar12 + 2;
  if ((long *)*plVar12 == plVar19) {
    local_518 = *plVar19;
    lStack_510 = plVar12[3];
  }
  else {
    local_518 = *plVar19;
    local_528 = (long *)*plVar12;
  }
  local_520 = plVar12[1];
  *plVar12 = (long)plVar19;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  plVar12 = (long *)std::__cxx11::string::_M_append((char *)&local_528,local_180._8_8_);
  local_698._M_dataplus._M_p = (pointer)&local_698.field_2;
  psVar18 = (size_type *)(plVar12 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar12 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar18) {
    local_698.field_2._M_allocated_capacity = *psVar18;
    local_698.field_2._8_8_ = plVar12[3];
  }
  else {
    local_698.field_2._M_allocated_capacity = *psVar18;
    local_698._M_dataplus._M_p = (pointer)*plVar12;
  }
  local_698._M_string_length = plVar12[1];
  *plVar12 = (long)psVar18;
  plVar12[1] = 0;
  *(undefined1 *)(plVar12 + 2) = 0;
  pTVar11 = (TextureFormat *)std::__cxx11::string::append((char *)&local_698);
  local_348 = (undefined1  [8])((long)local_348 + 0x10);
  TVar21 = (TextureFormat)(pTVar11 + 2);
  if (*pTVar11 == TVar21) {
    local_338 = *(size_type ***)TVar21;
    aStack_330._M_allocated_capacity = (size_type)pTVar11[3];
  }
  else {
    local_338 = *(size_type ***)TVar21;
    local_348 = (undefined1  [8])*pTVar11;
  }
  local_340 = pTVar11[1];
  *pTVar11 = TVar21;
  pTVar11[1].order = R;
  pTVar11[1].type = SNORM_INT8;
  *(undefined1 *)&pTVar11[2].order = R;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if (local_528 != &local_518) {
    operator_delete(local_528,local_518 + 1);
  }
  if (local_548 != &local_538) {
    operator_delete(local_548,local_538 + 1);
  }
  if (local_568 != &local_558) {
    operator_delete(local_568,local_558 + 1);
  }
  if (local_588 != &local_578) {
    operator_delete(local_588,local_578 + 1);
  }
  if (local_5a8 != &local_598) {
    operator_delete(local_5a8,local_598 + 1);
  }
  if (local_638 != &local_628) {
    operator_delete(local_638,local_628 + 1);
  }
  if (local_388 != local_378) {
    operator_delete(local_388,local_378[0] + 1);
  }
  if (local_618 != &local_608) {
    operator_delete(local_618,local_608 + 1);
  }
  if (local_5c8 != &local_5b8) {
    operator_delete(local_5c8,local_5b8 + 1);
  }
  if (local_4d0 != &local_4c0) {
    operator_delete(local_4d0,local_4c0 + 1);
  }
  if (local_4f8 != &local_4e8) {
    operator_delete(local_4f8,local_4e8 + 1);
  }
  if (local_1a0 != &local_190) {
    operator_delete(local_1a0,local_190 + 1);
  }
  if (local_1c0 != &local_1b0) {
    operator_delete(local_1c0,local_1b0 + 1);
  }
  if (local_498 != &local_488) {
    operator_delete(local_498,local_488 + 1);
  }
  if (local_368 != &local_358) {
    operator_delete(local_368,local_358 + 1);
  }
  if ((qpWatchDog **)local_158._0_8_ != local_148) {
    operator_delete((void *)local_158._0_8_,(ulong)((long)&local_148[0]->timeOutFunc + 1));
  }
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_698,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)local_348,(char *)TVar21);
  local_6c0 = (size_type *)CONCAT44(local_6c0._4_4_,1);
  local_6b8._M_dataplus._M_p = (pointer)&local_6b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_6b8,local_698._M_dataplus._M_p,
             local_698._M_dataplus._M_p + local_698._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_698._M_dataplus._M_p != &local_698.field_2) {
    operator_delete(local_698._M_dataplus._M_p,local_698.field_2._M_allocated_capacity + 1);
  }
  if (local_348 != (undefined1  [8])((long)local_348 + 0x10)) {
    operator_delete((void *)local_348,(long)local_338 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p != &local_670.field_2) {
    operator_delete(local_670._M_dataplus._M_p,local_670.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_478 + ((ulong)local_6c0 & 0xffffffff) * 0x18),&local_6b8);
  lVar28 = 0;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_128 + lVar28),
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(local_478 + lVar28));
    lVar28 = lVar28 + 0x18;
  } while (lVar28 != 0x90);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::vector
            (&local_98,&local_3e8);
  local_80 = local_3d0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_78,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_3c8);
  local_60 = (bool)uStack_3b0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6b8._M_dataplus._M_p != &local_6b8.field_2) {
    operator_delete(local_6b8._M_dataplus._M_p,local_6b8.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_5f8._8_8_ != local_5e8[0]._M_local_buf + 8) {
    operator_delete((void *)local_5f8._8_8_,local_5e8[0]._8_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_3c8);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_3e8);
  lVar28 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_478 + lVar28));
    lVar28 = lVar28 + -0x18;
  } while (lVar28 != -0x18);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180._8_8_ != &local_168) {
    operator_delete((void *)local_180._8_8_,local_168._M_allocated_capacity + 1);
  }
  pSVar7 = local_4a8;
  glu::ShaderProgram::ShaderProgram(local_4a8,local_500,(ProgramSources *)local_128);
  local_138.m_data.ptr = (ShaderProgram *)0x0;
  pMVar1 = &this->m_program;
  if ((this->m_program).
      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
      pSVar7) {
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&pMVar1->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
    (pMVar1->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data.
    ptr = pSVar7;
  }
  local_648 = pMVar1;
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&local_138);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_78);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_98);
  lVar28 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_128 + lVar28));
    lVar28 = lVar28 + -0x18;
  } while (lVar28 != -0x18);
  if (this->m_currentIteration == 0) {
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    (this->m_program).
                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.
                    m_data.ptr);
  }
  else {
    local_348 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(local_348 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,
               "Using a program similar to the previous one, except with a gather function call as follows:\n"
               ,0x5c);
    GVar5 = this->m_gatherType;
    getOffsetRange((TextureGatherCase *)local_128);
    genGatherFuncCall((string *)local_478,(TextureGatherCase *)(ulong)GVar5,(GatherType)local_508,
                      local_54,(GatherArgs *)local_3a8,(string *)local_128,
                      (IVec2 *)((ulong)in_stack_fffffffffffff92c << 0x20),in_stack_fffffffffffff930)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,(char *)local_478,(long)TStack_470);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if (local_478 != (undefined1  [8])local_468) {
      operator_delete((void *)local_478,local_468._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream(poVar2);
    std::ios_base::~ios_base(local_2d0);
  }
  lVar28 = local_4d8;
  pSVar7 = (local_648->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
           ).m_data.ptr;
  if ((pSVar7->m_program).m_info.linkOk == false) {
    if (this->m_currentIteration != 0) {
      glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,pSVar7
                     );
    }
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar15,"Failed to build program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
               ,0x561);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(local_4d8 + 0x1a00))(0,0,0x40,0x40);
  (**(code **)(lVar28 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar28 + 0x188))(0x4000);
  local_128._16_8_ = (pointer)0xbf8000003f800000;
  local_128._24_8_ = &DAT_3f8000003f800000;
  local_128._0_4_ = 0xbf800000;
  local_128._4_4_ = 0xbf800000;
  local_128._8_8_ = (TestContext *)0x3f800000bf800000;
  local_5e8[0]._M_allocated_capacity = 0x3f800000;
  local_5e8[0]._8_8_ = &DAT_3f8000003f800000;
  local_5f8._0_8_ = (pointer)0x0;
  local_5f8._8_8_ = 0x3f80000000000000;
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[9])
            (&local_670,this,(ulong)(uint)this->m_currentIteration);
  local_698._M_dataplus._M_p = (pointer)0x0;
  local_698._M_string_length = 0;
  local_698.field_2._M_allocated_capacity = 0;
  local_6c0 = (size_type *)((long)&local_6b8 + 8);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"a_position","");
  local_478._0_4_ = A;
  TVar21 = (TextureFormat)((long)local_468 + 8);
  TStack_470 = TVar21;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&TStack_470,local_6c0,local_6b8._M_dataplus._M_p + (long)local_6c0);
  uStack_450 = (ulong)uStack_450._4_4_ << 0x20;
  local_348._0_4_ = local_478._0_4_;
  local_340 = (TextureFormat)&aStack_330;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_348 + 8),TStack_470,(undefined1 *)(local_468._0_8_ + (long)TStack_470)
            );
  local_320 = (int)uStack_450;
  local_318[0].componentType = VTX_COMP_FLOAT;
  local_318[0].convert = VTX_COMP_CONVERT_NONE;
  local_318[0].numComponents = 2;
  local_318[0].numElements = 4;
  local_318[0].stride = 0;
  local_318[0].data = local_128;
  if (TStack_470 != TVar21) {
    operator_delete((void *)TStack_470,local_468._8_8_ + 1);
  }
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)&local_698
             ,(VertexArrayBinding *)local_348);
  if (local_340 != (TextureFormat)&aStack_330) {
    operator_delete((void *)local_340,aStack_330._M_allocated_capacity + 1);
  }
  if (local_6c0 != (size_type *)((long)&local_6b8 + 8U)) {
    operator_delete(local_6c0,local_6b8._M_string_length + 1);
  }
  local_6c0 = (size_type *)((long)&local_6b8 + 8U);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"a_texCoord","");
  _Var14._M_p = local_670._M_dataplus._M_p;
  iVar8 = (int)(local_670._M_string_length - (long)local_670._M_dataplus._M_p >> 2);
  iVar29 = iVar8 + 3;
  if (-1 < iVar8) {
    iVar29 = iVar8;
  }
  local_478._0_4_ = A;
  TStack_470 = TVar21;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&TStack_470,local_6c0,local_6b8._M_dataplus._M_p + (long)local_6c0);
  uStack_450 = uStack_450 & 0xffffffff00000000;
  local_348._0_4_ = local_478._0_4_;
  local_340 = (TextureFormat)&aStack_330;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_348 + 8),TStack_470,(undefined1 *)(local_468._0_8_ + (long)TStack_470)
            );
  local_318[0].numComponents = iVar29 >> 2;
  local_320 = (int)uStack_450;
  local_318[0].componentType = VTX_COMP_FLOAT;
  local_318[0].convert = VTX_COMP_CONVERT_NONE;
  local_318[0].numElements = 4;
  local_318[0].stride = 0;
  local_318[0].data = _Var14._M_p;
  if (TStack_470 != TVar21) {
    operator_delete((void *)TStack_470,local_468._8_8_ + 1);
  }
  psVar18 = (size_type *)((long)&local_6b8 + 8);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
  emplace_back<glu::VertexArrayBinding>
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)&local_698
             ,(VertexArrayBinding *)local_348);
  if (local_340 != (TextureFormat)&aStack_330) {
    operator_delete((void *)local_340,aStack_330._M_allocated_capacity + 1);
  }
  if (local_6c0 != psVar18) {
    operator_delete(local_6c0,local_6b8._M_string_length + 1);
  }
  if (bVar30) {
    local_6c0 = psVar18;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_6c0,"a_normalizedCoord","");
    local_478._0_4_ = A;
    TStack_470 = TVar21;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&TStack_470,local_6c0,local_6b8._M_dataplus._M_p + (long)local_6c0);
    uStack_450 = uStack_450 & 0xffffffff00000000;
    local_348._0_4_ = local_478._0_4_;
    local_340 = (TextureFormat)&aStack_330;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_348 + 8),TStack_470,
               (undefined1 *)(local_468._0_8_ + (long)TStack_470));
    local_320 = (int)uStack_450;
    local_318[0].componentType = VTX_COMP_FLOAT;
    local_318[0].convert = VTX_COMP_CONVERT_NONE;
    local_318[0].numComponents = 2;
    local_318[0].numElements = 4;
    local_318[0].stride = 0;
    local_318[0].data = local_5f8;
    if (TStack_470 != TVar21) {
      operator_delete((void *)TStack_470,local_468._8_8_ + 1);
    }
    std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::
    emplace_back<glu::VertexArrayBinding>
              ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)
               &local_698,(VertexArrayBinding *)local_348);
    if (local_340 != (TextureFormat)&aStack_330) {
      operator_delete((void *)local_340,aStack_330._M_allocated_capacity + 1);
    }
    if (local_6c0 != psVar18) {
      operator_delete(local_6c0,local_6b8._M_string_length + 1);
    }
  }
  lVar28 = local_4d8;
  pMVar1 = local_648;
  local_6c0 = (size_type *)0x2000200010000;
  local_6b8._M_dataplus._M_p._0_4_ = 0x30001;
  (**(code **)(local_4d8 + 0x1680))
            ((((local_648->
               super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data
              .ptr)->m_program).m_program);
  iVar8 = (**(code **)(lVar28 + 0xb48))
                    ((((pMVar1->
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       ).m_data.ptr)->m_program).m_program);
  if (iVar8 < 0) {
    pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar15,(char *)0x0,"samplerUniformLocation >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
               ,0x589);
    __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar28 + 0x14f0))(iVar8);
  if (GVar3 == GATHERTYPE_OFFSET_DYNAMIC) {
    iVar8 = (**(code **)(lVar28 + 0xb48))
                      ((((pMVar1->
                         super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                         ).m_data.ptr)->m_program).m_program);
    if (iVar8 < 0) {
      pTVar15 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar15,(char *)0x0,"viewportSizeUniformLocation >= 0",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTextureGatherTests.cpp"
                 ,0x590);
      __cxa_throw(pTVar15,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar28 + 0x1520))(0x42800000,0x42800000,iVar8);
  }
  lVar28 = (long)(local_670._M_string_length - (long)local_670._M_dataplus._M_p) >> 2;
  if (lVar28 == 0xc) {
    puVar22 = local_478;
    local_458 = (undefined1  [8])0x0;
    uStack_450 = 0;
    local_468._0_8_ = 0;
    local_468._8_8_ = 0;
    local_478._0_4_ = R;
    local_478._4_4_ = SNORM_INT8;
    TStack_470.order = R;
    TStack_470.type = SNORM_INT8;
    lVar28 = 0;
    _Var14._M_p = local_670._M_dataplus._M_p;
    do {
      lVar23 = 0;
      do {
        *(undefined4 *)(puVar22 + lVar23 * 4) = *(undefined4 *)(_Var14._M_p + lVar23 * 4);
        lVar23 = lVar23 + 1;
      } while (lVar23 != 3);
      lVar28 = lVar28 + 1;
      _Var14._M_p = _Var14._M_p + 0xc;
      puVar22 = puVar22 + 0xc;
    } while (lVar28 != 4);
    poVar2 = (ostringstream *)(local_348 + 8);
    local_348._0_4_ = local_4b0.order;
    local_348._4_4_ = local_4b0.type;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Texture coordinates run from ",0x1d);
    tcu::operator<<((ostream *)poVar2,(Vector<float,_3> *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," to ",4);
    tcu::operator<<((ostream *)poVar2,(Vector<float,_3> *)(local_458 + 4));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    if (lVar28 != 8) goto LAB_01658109;
    local_468._0_8_ = 0;
    local_468._8_8_ = 0;
    local_478._0_4_ = R;
    local_478._4_4_ = SNORM_INT8;
    TStack_470.order = R;
    TStack_470.type = SNORM_INT8;
    lVar28 = 0;
    _Var14._M_p = local_670._M_dataplus._M_p;
    do {
      lVar23 = 0;
      do {
        *(undefined4 *)(puVar22 + lVar23 * 4) = *(undefined4 *)(_Var14._M_p + lVar23 * 4);
        lVar23 = lVar23 + 1;
      } while (lVar23 == 1);
      lVar28 = lVar28 + 1;
      _Var14._M_p = _Var14._M_p + 8;
      puVar22 = puVar22 + 8;
    } while (lVar28 != 4);
    poVar2 = (ostringstream *)(local_348 + 8);
    local_348._0_4_ = local_4b0.order;
    local_348._4_4_ = local_4b0.type;
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"Texture coordinates run from ",0x1d);
    tcu::operator<<((ostream *)poVar2,(Vector<float,_2> *)local_478);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2," to ",4);
    tcu::operator<<((ostream *)poVar2,(Vector<float,_2> *)(local_468 + 8));
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_348,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_348 + 8));
  std::ios_base::~ios_base(local_2d0);
LAB_01658109:
  local_348._0_4_ = R;
  local_348._4_4_ = UNORM_INT32;
  local_340.order = 1;
  local_338 = &local_6c0;
  glu::draw(local_500,
            (((pMVar1->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
              ).m_data.ptr)->m_program).m_program,
            (int)(local_698._M_string_length - (long)local_698._M_dataplus._M_p >> 4) * -0x33333333,
            (VertexArrayBinding *)local_698._M_dataplus._M_p,(PrimitiveList *)local_348,
            (DrawUtilCallback *)0x0);
  std::vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_>::~vector
            ((vector<glu::VertexArrayBinding,_std::allocator<glu::VertexArrayBinding>_> *)&local_698
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_670._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    operator_delete(local_670._M_dataplus._M_p,
                    local_670.field_2._M_allocated_capacity - (long)local_670._M_dataplus._M_p);
  }
  tcu::TextureLevel::TextureLevel((TextureLevel *)local_5f8,&this->m_colorBufferFormat,0x40,0x40,1);
  if ((this->m_colorBufferFormat).order == RGBA) {
    CVar6 = (this->m_colorBufferFormat).type;
    if (((ulong)CVar6 < 0x22) && ((0x220000008U >> ((ulong)CVar6 & 0x3f) & 1) != 0)) {
      tcu::TextureLevel::getAccess((PixelBufferAccess *)local_348,(TextureLevel *)local_5f8);
      glu::readPixels(local_500,0,0,(PixelBufferAccess *)local_348);
    }
    else {
      CVar16 = SIGNED_INT32;
      if ((CVar6 - SIGNED_INT8 < 3) ||
         ((CVar6 < HALF_FLOAT &&
          (CVar16 = UNSIGNED_INT32, (0x2c0000000U >> ((ulong)CVar6 & 0x3f) & 1) != 0)))) {
        local_478._4_4_ = CVar16;
        local_478._0_4_ = RGBA;
        tcu::TextureLevel::TextureLevel
                  ((TextureLevel *)local_348,(TextureFormat *)local_478,0x40,0x40,1);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_478,(TextureLevel *)local_348);
        glu::readPixels(local_500,0,0,(PixelBufferAccess *)local_478);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_478,(TextureLevel *)local_5f8);
        tcu::TextureLevel::getAccess((PixelBufferAccess *)local_128,(TextureLevel *)local_348);
        tcu::copy((EVP_PKEY_CTX *)local_478,(EVP_PKEY_CTX *)local_128);
        tcu::TextureLevel::~TextureLevel((TextureLevel *)local_348);
      }
    }
  }
  uVar10 = this->m_currentIteration;
  tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)local_348,(TextureLevel *)local_5f8);
  iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[10])
                    (this,(ulong)uVar10,local_348);
  if ((char)iVar8 == '\0') {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "Result verification failed");
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_5f8);
    IVar24 = STOP;
  }
  else {
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_5f8);
    iVar29 = this->m_currentIteration + 1;
    this->m_currentIteration = iVar29;
    iVar8 = (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[7])(this);
    IVar24 = CONTINUE;
    if (iVar29 == iVar8) {
      IVar24 = STOP;
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  if ((undefined1 *)local_3a8._0_8_ != local_3a8 + 0x10) {
    operator_delete((void *)local_3a8._0_8_,local_3a8._16_8_ + 1);
  }
  tcu::TestLog::endSection(local_4a0.m_log);
  return IVar24;
}

Assistant:

TextureGatherCase::IterateResult TextureGatherCase::iterate (void)
{
	TestLog&						log								= m_testCtx.getLog();
	const tcu::ScopedLogSection		iterationSection				(log, "Iteration" + de::toString(m_currentIteration), "Iteration " + de::toString(m_currentIteration));
	const glu::RenderContext&		renderCtx						= m_context.getRenderContext();
	const glw::Functions&			gl								= renderCtx.getFunctions();
	const GatherArgs&				gatherArgs						= getGatherArgs(m_currentIteration);
	const string					refZExpr						= "v_normalizedCoord.x";
	const bool						needPixelCoordInShader			= m_gatherType == GATHERTYPE_OFFSET_DYNAMIC;
	const bool						needNormalizedCoordInShader		= needPixelCoordInShader || isDepthFormat(m_textureFormat);

	// Generate a program appropriate for this iteration.

	m_program = MovePtr<ShaderProgram>(new ShaderProgram(renderCtx, genProgramSources(m_gatherType, m_textureType, m_textureFormat, gatherArgs, refZExpr, getOffsetRange())));
	if (m_currentIteration == 0)
		m_testCtx.getLog() << *m_program;
	else
		m_testCtx.getLog() << TestLog::Message << "Using a program similar to the previous one, except with a gather function call as follows:\n"
											   << genGatherFuncCall(m_gatherType, m_textureFormat, gatherArgs, refZExpr, getOffsetRange(), 0)
											   << TestLog::EndMessage;
	if (!m_program->isOk())
	{
		if (m_currentIteration != 0)
			m_testCtx.getLog() << *m_program;
		TCU_FAIL("Failed to build program");
	}

	// Render.

	gl.viewport(0, 0, RENDER_SIZE.x(), RENDER_SIZE.y());
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	{
		const float position[4*2] =
		{
			-1.0f, -1.0f,
			-1.0f, +1.0f,
			+1.0f, -1.0f,
			+1.0f, +1.0f,
		};

		const float normalizedCoord[4*2] =
		{
			0.0f, 0.0f,
			0.0f, 1.0f,
			1.0f, 0.0f,
			1.0f, 1.0f,
		};

		const vector<float> texCoord = computeQuadTexCoord(m_currentIteration);

		vector<glu::VertexArrayBinding> attrBindings;
		attrBindings.push_back(glu::va::Float("a_position", 2, 4, 0, &position[0]));
		attrBindings.push_back(glu::va::Float("a_texCoord", (int)texCoord.size()/4, 4, 0, &texCoord[0]));
		if (needNormalizedCoordInShader)
			attrBindings.push_back(glu::va::Float("a_normalizedCoord", 2, 4, 0, &normalizedCoord[0]));

		const deUint16 indices[6] = { 0, 1, 2, 2, 1, 3 };

		gl.useProgram(m_program->getProgram());

		{
			const int samplerUniformLocation = gl.getUniformLocation(m_program->getProgram(), "u_sampler");
			TCU_CHECK(samplerUniformLocation >= 0);
			gl.uniform1i(samplerUniformLocation, 0);
		}

		if (needPixelCoordInShader)
		{
			const int viewportSizeUniformLocation = gl.getUniformLocation(m_program->getProgram(), "u_viewportSize");
			TCU_CHECK(viewportSizeUniformLocation >= 0);
			gl.uniform2f(viewportSizeUniformLocation, (float)RENDER_SIZE.x(), (float)RENDER_SIZE.y());
		}

		if (texCoord.size() == 2*4)
		{
			Vec2 texCoordVec[4];
			computeTexCoordVecs(texCoord, texCoordVec);
			log << TestLog::Message << "Texture coordinates run from " << texCoordVec[0] << " to " << texCoordVec[3] << TestLog::EndMessage;
		}
		else if (texCoord.size() == 3*4)
		{
			Vec3 texCoordVec[4];
			computeTexCoordVecs(texCoord, texCoordVec);
			log << TestLog::Message << "Texture coordinates run from " << texCoordVec[0] << " to " << texCoordVec[3] << TestLog::EndMessage;
		}
		else
			DE_ASSERT(false);

		glu::draw(renderCtx, m_program->getProgram(), (int)attrBindings.size(), &attrBindings[0],
			glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
	}

	// Verify result.

	{
		const tcu::TextureLevel rendered = getPixels(renderCtx, RENDER_SIZE, m_colorBufferFormat);

		if (!verify(m_currentIteration, rendered.getAccess()))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Result verification failed");
			return STOP;
		}
	}

	m_currentIteration++;
	if (m_currentIteration == (int)getNumIterations())
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}
	else
		return CONTINUE;
}